

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfile.cpp
# Opt level: O2

int __thiscall QFilePrivate::copy(QFilePrivate *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  long lVar1;
  QObject *this_00;
  char cVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Permissions permissions;
  FileError err;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *__buf;
  void *pvVar6;
  undefined4 extraout_var_01;
  size_t __nbytes;
  int __oflag;
  undefined8 unaff_RBP;
  undefined7 uVar7;
  QArrayDataPointer<char16_t> *this_01;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_1098;
  QArrayDataPointer<char16_t> local_1080;
  QSaveFile local_1068;
  QArrayDataPointer<char16_t> local_1058;
  char block [4096];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->super_QFileDevicePrivate).super_QIODevicePrivate.super_QObjectPrivate.
            super_QObjectData.q_ptr;
  iVar4 = (*(this->super_QFileDevicePrivate).super_QIODevicePrivate.super_QObjectPrivate.
            super_QObjectData._vptr_QObjectData[7])();
  cVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x58))
                    ((long *)CONCAT44(extraout_var,iVar4),dst);
  uVar7 = (undefined7)((ulong)unaff_RBP >> 8);
  iVar4 = (int)CONCAT71(uVar7,1);
  if (cVar2 != '\0') goto LAB_0021f827;
  iVar4 = (*((QObject *)&this_00->_vptr_QObject)->_vptr_QObject[0xd])(this_00,0x21);
  if ((char)iVar4 == '\0') {
    QFile::tr((QString *)&local_1058,"Cannot open %1 for input",(char *)0x0,-1);
    QString::arg<QString,_true>
              ((QString *)block,(QString *)&local_1058,&this->fileName,0,(QChar)0x20);
    QFileDevicePrivate::setError(&this->super_QFileDevicePrivate,CopyError,(QString *)block);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)block);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1058);
    iVar4 = 0;
    goto LAB_0021f827;
  }
  local_1068.super_QFileDevice.super_QIODevice.super_QObject._vptr_QObject =
       (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  local_1068.super_QFileDevice.super_QIODevice.super_QObject.d_ptr.d =
       (QObjectData *)&DAT_aaaaaaaaaaaaaaaa;
  QSaveFile::QSaveFile(&local_1068,(QString *)dst);
  QSaveFile::setDirectWriteFallback(&local_1068,true);
  iVar4 = QSaveFile::open(&local_1068,(char *)0x22,__oflag);
  if ((char)iVar4 == '\0') {
    (*((QObject *)&this_00->_vptr_QObject)->_vptr_QObject[0xe])(this_00);
    QFile::tr((QString *)&local_1058,"Cannot open for output: %1",(char *)0x0,-1);
    QIODevice::errorString((QString *)&local_1080,(QIODevice *)&local_1068);
    QString::arg<QString,_true>
              ((QString *)block,(QString *)&local_1058,(QString *)&local_1080,0,(QChar)0x20);
    QFileDevicePrivate::setError(&this->super_QFileDevicePrivate,CopyError,(QString *)block);
LAB_0021f7fd:
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)block);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1080);
LAB_0021f811:
    this_01 = &local_1058;
LAB_0021f816:
    QArrayDataPointer<char16_t>::~QArrayDataPointer(this_01);
    iVar4 = 0;
  }
  else {
    iVar4 = (*(this->super_QFileDevicePrivate).super_QIODevicePrivate.super_QObjectPrivate.
              super_QObjectData._vptr_QObjectData[7])(this);
    iVar5 = (*(local_1068.super_QFileDevice.super_QIODevice.super_QObject.d_ptr.d)->
              _vptr_QObjectData[7])();
    __nbytes = *(size_t *)CONCAT44(extraout_var_00,iVar4);
    cVar2 = (**(code **)(__nbytes + 0x100))((size_t *)CONCAT44(extraout_var_00,iVar4),iVar5);
    if (cVar2 == '\0') {
      (*((QObject *)&this_00->_vptr_QObject)->_vptr_QObject[0xe])(this_00);
      QFile::tr((QString *)&local_1058,"Could not copy to %1: %2",(char *)0x0,-1);
      iVar4 = (*(this->super_QFileDevicePrivate).super_QIODevicePrivate.super_QObjectPrivate.
                super_QObjectData._vptr_QObjectData[7])(this);
      QAbstractFileEngine::errorString
                ((QString *)&local_1080,(QAbstractFileEngine *)CONCAT44(extraout_var_01,iVar4));
      QString::arg<QString_const&,QString>
                ((type *)block,(QString *)&local_1058,(QString *)dst,(QString *)&local_1080);
      QFileDevicePrivate::setError(&this->super_QFileDevicePrivate,CopyError,(QString *)block);
      goto LAB_0021f7fd;
    }
    if (cVar2 == -1) {
      do {
        memset(block,0xaa,0x1000);
        iVar4 = (int)block;
        __buf = (void *)QIODevice::read((QIODevice *)this_00,iVar4,(void *)0x1000,__nbytes);
        if (__buf == (void *)0x0) goto LAB_0021f73a;
        if ((long)__buf < 0) {
          local_1058.d._0_4_ =
               *(undefined4 *)
                &(this->super_QFileDevicePrivate).super_QIODevicePrivate.errorString.d.d;
          local_1058.d._4_4_ =
               *(undefined4 *)
                ((long)&(this->super_QFileDevicePrivate).super_QIODevicePrivate.errorString.d.d + 4)
          ;
          local_1058.ptr._0_4_ =
               *(undefined4 *)
                &(this->super_QFileDevicePrivate).super_QIODevicePrivate.errorString.d.ptr;
          local_1058.ptr._4_4_ =
               *(undefined4 *)
                ((long)&(this->super_QFileDevicePrivate).super_QIODevicePrivate.errorString.d.ptr +
                4);
          (this->super_QFileDevicePrivate).super_QIODevicePrivate.errorString.d.d = (Data *)0x0;
          (this->super_QFileDevicePrivate).super_QIODevicePrivate.errorString.d.ptr =
               (char16_t *)0x0;
          local_1058.size =
               (this->super_QFileDevicePrivate).super_QIODevicePrivate.errorString.d.size;
          (this->super_QFileDevicePrivate).super_QIODevicePrivate.errorString.d.size = 0;
          (*((QObject *)&this_00->_vptr_QObject)->_vptr_QObject[0xe])(this_00);
          QFileDevicePrivate::setError
                    (&this->super_QFileDevicePrivate,CopyError,(QString *)&local_1058);
          goto LAB_0021f811;
        }
        pvVar6 = (void *)QIODevice::write((QIODevice *)&local_1068,iVar4,__buf,__nbytes);
      } while (__buf == pvVar6);
      (*((QObject *)&this_00->_vptr_QObject)->_vptr_QObject[0xe])(this_00);
      QFile::tr((QString *)&local_1080,"Failure to write block: %1",(char *)0x0,-1);
      QIODevice::errorString((QString *)&QStack_1098,(QIODevice *)&local_1068);
      QString::arg<QString,_true>
                ((QString *)&local_1058,(QString *)&local_1080,(QString *)&QStack_1098,0,(QChar)0x20
                );
      QFileDevicePrivate::setError(&this->super_QFileDevicePrivate,CopyError,(QString *)&local_1058)
      ;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1058);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_1098);
      this_01 = &local_1080;
      goto LAB_0021f816;
    }
LAB_0021f73a:
    permissions.super_QFlagsStorageHelper<QFileDevice::Permission,_4>.
    super_QFlagsStorage<QFileDevice::Permission>.i =
         (QFlagsStorageHelper<QFileDevice::Permission,_4>)
         (*((QObject *)&this_00->_vptr_QObject)->_vptr_QObject[0x1f])(this_00);
    QFileDevice::setPermissions(&local_1068.super_QFileDevice,permissions);
    (*((QObject *)&this_00->_vptr_QObject)->_vptr_QObject[0xe])(this_00);
    bVar3 = QSaveFile::commit(&local_1068);
    iVar4 = (int)CONCAT71(uVar7,1);
    if (!bVar3) {
      err = QFileDevice::error(&local_1068.super_QFileDevice);
      QIODevice::errorString((QString *)block,(QIODevice *)&local_1068);
      QFileDevicePrivate::setError(&this->super_QFileDevicePrivate,err,(QString *)block);
      this_01 = (QArrayDataPointer<char16_t> *)block;
      goto LAB_0021f816;
    }
  }
  QSaveFile::~QSaveFile(&local_1068);
LAB_0021f827:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QFilePrivate::copy(const QString &newName)
{
    Q_Q(QFile);
    Q_ASSERT(error == QFile::NoError);
    Q_ASSERT(!q->isOpen());

    // Some file engines can perform this copy more efficiently (e.g., Windows
    // calling CopyFile).
    if (engine()->copy(newName))
        return true;

    if (!q->open(QFile::ReadOnly | QFile::Unbuffered)) {
        setError(QFile::CopyError, QFile::tr("Cannot open %1 for input").arg(fileName));
        return false;
    }

    QSaveFile out(newName);
    out.setDirectWriteFallback(true);
    if (!out.open(QIODevice::WriteOnly | QIODevice::Unbuffered)) {
        q->close();
        setError(QFile::CopyError, QFile::tr("Cannot open for output: %1").arg(out.errorString()));
        return false;
    }

    // Attempt to do an OS-level data copy
    QAbstractFileEngine::TriStateResult r = engine()->cloneTo(out.d_func()->engine());
    if (r == QAbstractFileEngine::TriStateResult::Failed) {
        q->close();
        setError(QFile::CopyError, QFile::tr("Could not copy to %1: %2")
                 .arg(newName, engine()->errorString()));
        return false;
    }

    while (r == QAbstractFileEngine::TriStateResult::NotSupported) {
        // OS couldn't do it, so do a block-level copy
        char block[4096];
        qint64 in = q->read(block, sizeof(block));
        if (in == 0)
            break;      // eof
        if (in < 0) {
            // Unable to read from the source. Save the error from read() above.
            QString s = std::move(errorString);
            q->close();
            setError(QFile::CopyError, std::move(s));
            return false;
        }
        if (in != out.write(block, in)) {
            q->close();
            setError(QFile::CopyError, QFile::tr("Failure to write block: %1")
                     .arg(out.errorString()));
            return false;
        }
    }

    // copy the permissions
    out.setPermissions(q->permissions());
    q->close();

    // final step: commit the copy
    if (out.commit())
        return true;
    setError(out.error(), out.errorString());
    return false;
}